

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O1

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket,
          SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  
  if (DAT_015d6420 == '\x01') {
    uVar4 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
    if ((HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).heapBucket != heapBucket)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar3) goto LAB_006ddc2e;
      *puVar5 = 0;
    }
    SmallHeapBlockT<SmallAllocationBlockAttributes>::BackgroundReleasePagesSweep
              (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>,this->recycler);
    pSVar1 = &((this->normalData).bucketData[uVar4].pendingEmptyBlockList)->
              super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      if ((this->normalData).bucketData[uVar4].pendingEmptyBlockListTail !=
          (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar3) {
LAB_006ddc2e:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar5 = 0;
      }
      (this->normalData).bucketData[uVar4].pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
    }
    (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next = pSVar1;
    (this->normalData).bucketData[uVar4].pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}